

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O2

void png_build_gamma_table(png_structrp png_ptr,int bit_depth)

{
  undefined1 uVar1;
  byte bVar2;
  png_uint_16 pVar3;
  png_fixed_point pVar4;
  png_uint_16pp pppVar5;
  png_uint_16 *ppVar6;
  byte bVar7;
  uint shift;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  double dVar13;
  png_fixed_point local_40;
  
  if ((png_ptr->gamma_table != (png_bytep)0x0) || (png_ptr->gamma_16_table != (png_uint_16pp)0x0)) {
    png_warning(png_ptr,"gamma table being rebuilt");
    png_destroy_gamma_table(png_ptr);
  }
  if (bit_depth < 9) {
    if (png_ptr->screen_gamma < 1) {
      pVar4 = 100000;
    }
    else {
      pVar4 = png_reciprocal2((png_ptr->colorspace).gamma,png_ptr->screen_gamma);
    }
    png_build_8bit_table(png_ptr,&png_ptr->gamma_table,pVar4);
    if ((png_ptr->transformations & 0x600080) != 0) {
      pVar4 = png_reciprocal((png_ptr->colorspace).gamma);
      png_build_8bit_table(png_ptr,&png_ptr->gamma_to_1,pVar4);
      if (png_ptr->screen_gamma < 1) {
        pVar4 = (png_ptr->colorspace).gamma;
      }
      else {
        pVar4 = png_reciprocal(png_ptr->screen_gamma);
      }
      png_build_8bit_table(png_ptr,&png_ptr->gamma_from_1,pVar4);
      return;
    }
  }
  else {
    if ((png_ptr->color_type & 2) == 0) {
      bVar2 = (png_ptr->sig_bit).gray;
    }
    else {
      uVar1 = (png_ptr->sig_bit).red;
      bVar7 = (png_ptr->sig_bit).green;
      bVar2 = uVar1;
      if ((byte)uVar1 < bVar7) {
        bVar2 = bVar7;
      }
      bVar7 = (png_ptr->sig_bit).blue;
      if (bVar2 < bVar7) {
        bVar2 = bVar7;
      }
    }
    bVar7 = 0x10 - bVar2;
    if (0xe < (byte)(bVar2 - 1)) {
      bVar7 = 0;
    }
    bVar2 = 5;
    if (5 < bVar7) {
      bVar2 = bVar7;
    }
    if ((png_ptr->transformations & 0x4000400) == 0) {
      bVar2 = bVar7;
    }
    if (7 < bVar2) {
      bVar2 = 8;
    }
    shift = (uint)bVar2;
    png_ptr->gamma_shift = shift;
    iVar12 = png_ptr->screen_gamma;
    if ((png_ptr->transformations & 0x4000400) == 0) {
      if (iVar12 < 1) {
        pVar4 = 100000;
      }
      else {
        pVar4 = png_reciprocal2((png_ptr->colorspace).gamma,iVar12);
      }
      png_build_16bit_table(png_ptr,&png_ptr->gamma_16_table,(uint)bVar2,pVar4);
    }
    else {
      if (iVar12 < 1) {
        local_40 = 100000;
      }
      else {
        dVar13 = floor((double)iVar12 * (double)(png_ptr->colorspace).gamma * 1e-05 + 0.5);
        local_40 = (png_fixed_point)dVar13;
        if (dVar13 < -2147483648.0) {
          local_40 = 0;
        }
        if (2147483647.0 < dVar13) {
          local_40 = 0;
        }
      }
      bVar7 = 8 - bVar2;
      uVar9 = (ulong)(uint)(1 << (bVar7 & 0x1f));
      pppVar5 = (png_uint_16pp)png_calloc(png_ptr,uVar9 * 8);
      png_ptr->gamma_16_table = pppVar5;
      for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
        ppVar6 = (png_uint_16 *)png_malloc(png_ptr,0x200);
        pppVar5[uVar11] = ppVar6;
      }
      uVar10 = 0xff >> (bVar2 & 0x1f);
      uVar8 = 0;
      for (iVar12 = 0; iVar12 != 0xff; iVar12 = iVar12 + 1) {
        pVar3 = png_gamma_16bit_correct((iVar12 * 0x101 & 0xffffU) + 0x80,local_40);
        for (; uVar8 <= ((((uint)pVar3 << (0x10 - bVar2 & 0x1f)) - (uint)pVar3) + 0x8000) / 0xffff;
            uVar8 = uVar8 + 1) {
          pppVar5[uVar8 & uVar10][uVar8 >> (bVar7 & 0x1f)] = (png_uint_16)(iVar12 * 0x101);
        }
      }
      for (; uVar8 < (uint)(0x100 << (bVar7 & 0x1f)); uVar8 = uVar8 + 1) {
        pppVar5[uVar8 & uVar10][uVar8 >> (bVar7 & 0x1f)] = 0xffff;
      }
    }
    if ((png_ptr->transformations & 0x600080) != 0) {
      pVar4 = png_reciprocal((png_ptr->colorspace).gamma);
      png_build_16bit_table(png_ptr,&png_ptr->gamma_16_to_1,shift,pVar4);
      if (png_ptr->screen_gamma < 1) {
        pVar4 = (png_ptr->colorspace).gamma;
      }
      else {
        pVar4 = png_reciprocal(png_ptr->screen_gamma);
      }
      png_build_16bit_table(png_ptr,&png_ptr->gamma_16_from_1,shift,pVar4);
      return;
    }
  }
  return;
}

Assistant:

void /* PRIVATE */
png_build_gamma_table(png_structrp png_ptr, int bit_depth)
{
   png_debug(1, "in png_build_gamma_table");

   /* Remove any existing table; this copes with multiple calls to
    * png_read_update_info. The warning is because building the gamma tables
    * multiple times is a performance hit - it's harmless but the ability to
    * call png_read_update_info() multiple times is new in 1.5.6 so it seems
    * sensible to warn if the app introduces such a hit.
    */
   if (png_ptr->gamma_table != NULL || png_ptr->gamma_16_table != NULL)
   {
      png_warning(png_ptr, "gamma table being rebuilt");
      png_destroy_gamma_table(png_ptr);
   }

   if (bit_depth <= 8)
   {
      png_build_8bit_table(png_ptr, &png_ptr->gamma_table,
          png_ptr->screen_gamma > 0 ?
          png_reciprocal2(png_ptr->colorspace.gamma,
          png_ptr->screen_gamma) : PNG_FP_1);

#if defined(PNG_READ_BACKGROUND_SUPPORTED) || \
   defined(PNG_READ_ALPHA_MODE_SUPPORTED) || \
   defined(PNG_READ_RGB_TO_GRAY_SUPPORTED)
      if ((png_ptr->transformations & (PNG_COMPOSE | PNG_RGB_TO_GRAY)) != 0)
      {
         png_build_8bit_table(png_ptr, &png_ptr->gamma_to_1,
             png_reciprocal(png_ptr->colorspace.gamma));

         png_build_8bit_table(png_ptr, &png_ptr->gamma_from_1,
             png_ptr->screen_gamma > 0 ?
             png_reciprocal(png_ptr->screen_gamma) :
             png_ptr->colorspace.gamma/* Probably doing rgb_to_gray */);
      }
#endif /* READ_BACKGROUND || READ_ALPHA_MODE || RGB_TO_GRAY */
   }
#ifdef PNG_16BIT_SUPPORTED
   else
   {
      png_byte shift, sig_bit;

      if ((png_ptr->color_type & PNG_COLOR_MASK_COLOR) != 0)
      {
         sig_bit = png_ptr->sig_bit.red;

         if (png_ptr->sig_bit.green > sig_bit)
            sig_bit = png_ptr->sig_bit.green;

         if (png_ptr->sig_bit.blue > sig_bit)
            sig_bit = png_ptr->sig_bit.blue;
      }
      else
         sig_bit = png_ptr->sig_bit.gray;

      /* 16-bit gamma code uses this equation:
       *
       *   ov = table[(iv & 0xff) >> gamma_shift][iv >> 8]
       *
       * Where 'iv' is the input color value and 'ov' is the output value -
       * pow(iv, gamma).
       *
       * Thus the gamma table consists of up to 256 256-entry tables.  The table
       * is selected by the (8-gamma_shift) most significant of the low 8 bits
       * of the color value then indexed by the upper 8 bits:
       *
       *   table[low bits][high 8 bits]
       *
       * So the table 'n' corresponds to all those 'iv' of:
       *
       *   <all high 8-bit values><n << gamma_shift>..<(n+1 << gamma_shift)-1>
       *
       */
      if (sig_bit > 0 && sig_bit < 16U)
         /* shift == insignificant bits */
         shift = (png_byte)((16U - sig_bit) & 0xff);

      else
         shift = 0; /* keep all 16 bits */

      if ((png_ptr->transformations & (PNG_16_TO_8 | PNG_SCALE_16_TO_8)) != 0)
      {
         /* PNG_MAX_GAMMA_8 is the number of bits to keep - effectively
          * the significant bits in the *input* when the output will
          * eventually be 8 bits.  By default it is 11.
          */
         if (shift < (16U - PNG_MAX_GAMMA_8))
            shift = (16U - PNG_MAX_GAMMA_8);
      }

      if (shift > 8U)
         shift = 8U; /* Guarantees at least one table! */

      png_ptr->gamma_shift = shift;

      /* NOTE: prior to 1.5.4 this test used to include PNG_BACKGROUND (now
       * PNG_COMPOSE).  This effectively smashed the background calculation for
       * 16-bit output because the 8-bit table assumes the result will be
       * reduced to 8 bits.
       */
      if ((png_ptr->transformations & (PNG_16_TO_8 | PNG_SCALE_16_TO_8)) != 0)
          png_build_16to8_table(png_ptr, &png_ptr->gamma_16_table, shift,
          png_ptr->screen_gamma > 0 ? png_product2(png_ptr->colorspace.gamma,
          png_ptr->screen_gamma) : PNG_FP_1);

      else
          png_build_16bit_table(png_ptr, &png_ptr->gamma_16_table, shift,
          png_ptr->screen_gamma > 0 ? png_reciprocal2(png_ptr->colorspace.gamma,
          png_ptr->screen_gamma) : PNG_FP_1);

#if defined(PNG_READ_BACKGROUND_SUPPORTED) || \
   defined(PNG_READ_ALPHA_MODE_SUPPORTED) || \
   defined(PNG_READ_RGB_TO_GRAY_SUPPORTED)
      if ((png_ptr->transformations & (PNG_COMPOSE | PNG_RGB_TO_GRAY)) != 0)
      {
         png_build_16bit_table(png_ptr, &png_ptr->gamma_16_to_1, shift,
             png_reciprocal(png_ptr->colorspace.gamma));

         /* Notice that the '16 from 1' table should be full precision, however
          * the lookup on this table still uses gamma_shift, so it can't be.
          * TODO: fix this.
          */
         png_build_16bit_table(png_ptr, &png_ptr->gamma_16_from_1, shift,
             png_ptr->screen_gamma > 0 ? png_reciprocal(png_ptr->screen_gamma) :
             png_ptr->colorspace.gamma/* Probably doing rgb_to_gray */);
      }
#endif /* READ_BACKGROUND || READ_ALPHA_MODE || RGB_TO_GRAY */
   }
#endif /* 16BIT */
}